

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testNNValidatorReshape4D(void)

{
  RepeatedField<long> *pRVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  long *plVar8;
  FeatureDescription *pFVar9;
  ArrayFeatureType *pAVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  LayerUnion LVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  Arena *pAVar18;
  uint uVar19;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar4 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0016348c:
    pRVar17 = &(local_80.description_)->input_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar2 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_0016348c;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar13 = pRVar4->elements[iVar2];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar16);
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar18);
    (pFVar7->Type_).multiarraytype_ = pAVar10;
  }
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  if (uVar3 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 1;
  }
  pRVar1->current_size_ = uVar3 + 1;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar4 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001635b7:
    pRVar17 = &(local_80.description_)->output_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar2 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_001635b7;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar13 = pRVar4->elements[iVar2];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"output",puVar16);
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar18);
    (pFVar7->Type_).multiarraytype_ = pAVar10;
  }
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  if (uVar3 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 1;
  }
  pRVar1->current_size_ = uVar3 + 1;
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar18);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001636fb:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(local_80.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar11);
  }
  else {
    iVar2 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_001636fb;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar2 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar2];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00163734:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar2 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar2) goto LAB_00163734;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar13 = pRVar4->elements[iVar2];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3a8ef3);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar2 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar4->allocated_size) {
      (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pvVar13 = pRVar4->elements[iVar2];
      goto LAB_0016379f;
    }
  }
  pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
LAB_0016379f:
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3bbdaf);
  if (pNVar11->_oneof_case_[0] == 300) {
    LVar14 = pNVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 300;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    LVar14.reshape_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ReshapeLayerParams>
                   (pAVar18);
    (pNVar11->layer_).reshape_ = (ReshapeLayerParams *)LVar14;
  }
  pRVar1 = &(LVar14.reshape_)->targetshape_;
  uVar3 = ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->current_size_;
  if (uVar3 == ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 1;
  }
  uVar19 = uVar3 + 1;
  ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->current_size_ = uVar19;
  if (uVar19 == ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 2);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar19] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar19] = 1;
  }
  uVar19 = uVar3 + 2;
  ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->current_size_ = uVar19;
  if (uVar19 == ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 3);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar19] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar19] = 1;
  }
  uVar19 = uVar3 + 3;
  ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->current_size_ = uVar19;
  if (uVar19 == ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 4);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar19] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar19] = 1;
  }
  ((RepeatedField<long> *)&(LVar14.convolution_)->kernelsize_)->current_size_ = uVar3 + 4;
  (LVar14.padding_)->_oneof_case_[0] = 0;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar6 = CoreML::Result::good(&local_50);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,900);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)!bVar6;
}

Assistant:

int testNNValidatorReshape4D() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *reshapeLayer = nn->add_layers();
    reshapeLayer->add_input("input");
    reshapeLayer->add_output("output");
    Specification::ReshapeLayerParams *reshapeParams = reshapeLayer->mutable_reshape();

    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);

    reshapeParams->set_mode(::CoreML::Specification::ReshapeLayerParams_ReshapeOrder::ReshapeLayerParams_ReshapeOrder_CHANNEL_FIRST); Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}